

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O3

void __thiscall NavierStokesBase::initialize_eb2_structs(NavierStokesBase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BaseFab<int> *pBVar4;
  EBCellFlagFab *this_00;
  char cVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  FabArray<amrex::EBCellFlagFab> *pFVar8;
  FabType FVar9;
  int iVar10;
  long lVar11;
  MultiFab *pMVar12;
  MultiCutFab *pMVar13;
  FabArray<amrex::EBCellFlagFab> *pFVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  Box bx;
  Box tbox;
  BoxIterator bit;
  MFIter mfi;
  Box local_264;
  FabArray<amrex::EBCellFlagFab> *local_248;
  FabArray<amrex::BaseFab<int>_> *local_240;
  Box local_238;
  undefined1 local_218 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_208;
  int local_1f0;
  MFIter local_90;
  
  local_218._8_8_ = amrex::OutStream();
  local_218._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  local_218._0_4_ = *(int *)(DAT_0071a620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_208);
  *(undefined8 *)
   ((long)&vStack_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish +
   vStack_208.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
       *(undefined8 *)(local_218._8_8_ + *(long *)(*(long *)local_218._8_8_ + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&vStack_208,"Initializing EB2 structs",0x18);
  cVar5 = (char)(ostringstream *)&vStack_208;
  std::ios::widen((char)vStack_208.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  amrex::Print::~Print((Print *)local_218);
  no_eb_in_domain = false;
  local_240 = &this->ebmask;
  local_218._0_8_ = (MultiCutFab *)0x1;
  local_218._8_8_ = (MultiCutFab *)0x0;
  vStack_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.smallend.vect._0_8_ = &PTR__FabFactory_00712c30;
  local_90.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_90.fabArray._0_4_ = 0;
  (*(this->ebmask).super_FabArrayBase._vptr_FabArrayBase[3])
            (local_240,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,1,&local_90,
             local_218,&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_208);
  lVar11 = __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar11 == 0) {
    __cxa_bad_cast();
  }
  pMVar12 = amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar11 + 0xd8));
  this->volfrac = pMVar12;
  pMVar13 = amrex::EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar11 + 0xd8));
  this->bndrycent = pMVar13;
  amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar11 + 0xd8));
  (this->areafrac)._M_elems[2] =
       (MultiCutFab *)
       vStack_208.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->areafrac)._M_elems[0] = (MultiCutFab *)local_218._0_8_;
  (this->areafrac)._M_elems[1] = (MultiCutFab *)local_218._8_8_;
  amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar11 + 0xd8));
  (this->facecent)._M_elems[2] =
       (MultiCutFab *)
       vStack_208.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->facecent)._M_elems[0] = (MultiCutFab *)local_218._0_8_;
  (this->facecent)._M_elems[1] = (MultiCutFab *)local_218._8_8_;
  pFVar14 = amrex::EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar11 + 0xd8));
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)this->volfrac,false);
  pFVar8 = pFVar14;
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      local_248 = pFVar8;
      iVar10 = local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar10 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_90.currentIndex];
      }
      pBVar4 = (this->ebmask).m_fabs_v.
               super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar10];
      amrex::MFIter::growntilebox(&local_238,&local_90,-1000000);
      amrex::MFIter::tilebox(&local_264,&local_90);
      piVar15 = &local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar15 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_90.currentIndex;
      }
      this_00 = (pFVar14->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar15];
      FVar9 = amrex::EBCellFlagFab::getType(this_00,&local_238);
      if (FVar9 == covered) {
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  ((Array4<int> *)local_218,local_240,&local_90);
        pFVar14 = local_248;
        if (local_264.smallend.vect[2] <= local_264.bigend.vect[2]) {
          iVar10 = local_264.smallend.vect[2];
          do {
            if (local_264.smallend.vect[1] <= local_264.bigend.vect[1]) {
              iVar16 = local_264.smallend.vect[1];
              do {
                if (local_264.smallend.vect[0] <= local_264.bigend.vect[0]) {
                  iVar17 = local_264.smallend.vect[0] -
                           (int)vStack_208.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  iVar19 = (local_264.bigend.vect[0] - local_264.smallend.vect[0]) + 1;
                  do {
                    *(undefined4 *)
                     ((long)&(((FabArray<amrex::CutFab> *)local_218._0_8_)->super_FabArrayBase).
                             _vptr_FabArrayBase +
                     (((long)iVar10 - (long)local_1f0) *
                      (long)vStack_208.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     ((long)iVar16 -
                     (long)vStack_208.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                     local_218._8_8_ + (long)iVar17) * 4) = 0xffffffff;
                    iVar17 = iVar17 + 1;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
                bVar20 = iVar16 != local_264.bigend.vect[1];
                iVar16 = iVar16 + 1;
              } while (bVar20);
            }
            bVar20 = iVar10 != local_264.bigend.vect[2];
            iVar10 = iVar10 + 1;
          } while (bVar20);
        }
      }
      else {
        if (FVar9 == singlevalued) {
          vStack_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)vStack_208.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffff00000000);
          vStack_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_218._0_8_ = (int *)0x0;
          local_218._8_8_ = (ostream *)0x0;
          amrex::BoxIterator::define((BoxIterator *)local_218,&local_238);
          vStack_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)vStack_208.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffff00000000);
          vStack_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_218._0_8_ = (MultiCutFab *)0x0;
          local_218._8_8_ = (MultiCutFab *)0x0;
          amrex::BoxIterator::define((BoxIterator *)local_218,&local_238);
          do {
            iVar10 = local_218._8_4_;
            while( true ) {
              if ((int)vStack_208.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage < iVar10)
              goto LAB_0022538b;
              uVar7 = local_218._4_4_;
              uVar6 = local_218._0_4_;
              iVar16 = local_218._4_4_;
              if (((int)vStack_208.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage == iVar10) &&
                 ((vStack_208.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_ < (int)local_218._4_4_ ||
                  ((vStack_208.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_ == local_218._4_4_ &&
                   (iVar16 = vStack_208.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                   (int)vStack_208.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish < (int)local_218._0_4_))))))
              goto LAB_0022538b;
              iVar17 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
              iVar19 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
              iVar1 = (pBVar4->domain).smallend.vect[0];
              uVar18 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr
                       [(long)(local_218._0_4_ - iVar17) +
                        (long)(((((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1]
                                 - iVar19) + 1) *
                                (iVar10 - (this_00->super_BaseFab<amrex::EBCellFlag>).domain.
                                          smallend.vect[2]) + (iVar16 - iVar19)) *
                              (((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] -
                               iVar17) + 1))].flag & 3;
              if (uVar18 == 0) {
                if (iVar1 <= (int)local_218._0_4_) {
                  iVar17 = (pBVar4->domain).smallend.vect[1];
                  if ((((iVar17 <= iVar16) &&
                       (iVar19 = (pBVar4->domain).smallend.vect[2], iVar19 <= iVar10)) &&
                      (iVar2 = (pBVar4->domain).bigend.vect[0], (int)local_218._0_4_ <= iVar2)) &&
                     ((iVar3 = (pBVar4->domain).bigend.vect[1], iVar16 <= iVar3 &&
                      (iVar10 <= (pBVar4->domain).bigend.vect[2])))) {
                    pBVar4->dptr
                    [(long)(local_218._0_4_ - iVar1) +
                     (long)(((iVar16 - iVar17) + ((iVar3 - iVar17) + 1) * (iVar10 - iVar19)) *
                           ((iVar2 - iVar1) + 1))] = 1;
                  }
                }
              }
              else if (uVar18 == 3) {
                if (iVar1 <= (int)local_218._0_4_) {
                  iVar17 = (pBVar4->domain).smallend.vect[1];
                  if ((((iVar17 <= iVar16) &&
                       (iVar19 = (pBVar4->domain).smallend.vect[2], iVar19 <= iVar10)) &&
                      (iVar2 = (pBVar4->domain).bigend.vect[0], (int)local_218._0_4_ <= iVar2)) &&
                     ((iVar3 = (pBVar4->domain).bigend.vect[1], iVar16 <= iVar3 &&
                      (iVar10 <= (pBVar4->domain).bigend.vect[2])))) {
                    pBVar4->dptr
                    [(long)(local_218._0_4_ - iVar1) +
                     (long)(((iVar16 - iVar17) + ((iVar3 - iVar17) + 1) * (iVar10 - iVar19)) *
                           ((iVar2 - iVar1) + 1))] = -1;
                  }
                }
              }
              else if (iVar1 <= (int)local_218._0_4_) {
                iVar17 = (pBVar4->domain).smallend.vect[1];
                if (((iVar17 <= iVar16) &&
                    (iVar19 = (pBVar4->domain).smallend.vect[2], iVar19 <= iVar10)) &&
                   ((iVar2 = (pBVar4->domain).bigend.vect[0], (int)local_218._0_4_ <= iVar2 &&
                    ((iVar3 = (pBVar4->domain).bigend.vect[1], iVar16 <= iVar3 &&
                     (iVar10 <= (pBVar4->domain).bigend.vect[2])))))) {
                  pBVar4->dptr
                  [(long)(local_218._0_4_ - iVar1) +
                   (long)(((iVar16 - iVar17) + ((iVar3 - iVar17) + 1) * (iVar10 - iVar19)) *
                         ((iVar2 - iVar1) + 1))] = 0;
                }
              }
              local_218._0_4_ = local_218._0_4_ + 1;
              if ((int)uVar6 <
                  (int)vStack_208.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) break;
              local_218._4_4_ = local_218._4_4_ + 1;
              local_218._0_4_ = local_218._12_4_;
              iVar10 = local_218._8_4_;
              if (vStack_208.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._4_4_ <= (int)uVar7) {
                local_218._4_4_ =
                     (int)vStack_208.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar10 = local_218._8_4_ + 1;
                local_218._8_4_ = iVar10;
              }
            }
          } while( true );
        }
        if (FVar9 == regular) {
          amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                    ((Array4<int> *)local_218,local_240,&local_90);
          pFVar14 = local_248;
          if (local_264.smallend.vect[2] <= local_264.bigend.vect[2]) {
            iVar10 = local_264.smallend.vect[2];
            do {
              if (local_264.smallend.vect[1] <= local_264.bigend.vect[1]) {
                iVar16 = local_264.smallend.vect[1];
                do {
                  if (local_264.smallend.vect[0] <= local_264.bigend.vect[0]) {
                    iVar17 = local_264.smallend.vect[0] -
                             (int)vStack_208.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    iVar19 = (local_264.bigend.vect[0] - local_264.smallend.vect[0]) + 1;
                    do {
                      *(undefined4 *)
                       ((long)&(((FabArray<amrex::CutFab> *)local_218._0_8_)->super_FabArrayBase).
                               _vptr_FabArrayBase +
                       (((long)iVar10 - (long)local_1f0) *
                        (long)vStack_208.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                       ((long)iVar16 -
                       (long)vStack_208.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                       local_218._8_8_ + (long)iVar17) * 4) = 1;
                      iVar17 = iVar17 + 1;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                  }
                  bVar20 = iVar16 != local_264.bigend.vect[1];
                  iVar16 = iVar16 + 1;
                } while (bVar20);
              }
              bVar20 = iVar10 != local_264.bigend.vect[2];
              iVar10 = iVar10 + 1;
            } while (bVar20);
          }
        }
        else {
          local_218._8_8_ = amrex::OutStream();
          local_218._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
          local_218._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_208);
          *(undefined8 *)
           ((long)&vStack_208.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish +
           (long)(((MultiCutFab *)
                  ((long)vStack_208.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + -0x188))->m_data).pcd._M_t.
                 super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                 .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>._M_head_impl) =
               *(undefined8 *)
                ((long)&(((FabArray<amrex::CutFab> *)local_218._8_8_)->super_FabArrayBase).boxarray.
                        m_bat.m_bat_type +
                (long)(((FabArray<amrex::CutFab> *)local_218._8_8_)->super_FabArrayBase).
                      _vptr_FabArrayBase[-3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vStack_208,"unknown (or multivalued) fab type",0x21);
          cVar5 = (char)(ostringstream *)&vStack_208;
          std::ios::widen((char)(((MultiCutFab *)
                                 ((long)vStack_208.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + -0x188))->m_data
                                ).pcd._M_t.
                                super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                                .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>.
                                _M_head_impl + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          amrex::Print::~Print((Print *)local_218);
          amrex::Abort_host((char *)0x0);
        }
      }
LAB_0022538b:
      amrex::MFIter::operator++(&local_90);
      pFVar8 = local_248;
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
NavierStokesBase::initialize_eb2_structs() {

  amrex::Print() << "Initializing EB2 structs" << std::endl;

  // NOTE: THIS NEEDS TO BE REPLACED WITH A FLAGFAB 
  
  // n.b., could set this to 1 if geometry is all_regular as an optimization
  no_eb_in_domain = 0;

  //  1->regular, 0->irregular, -1->covered, 2->outside
  ebmask.define(grids, dmap,  1, 0);
  
  const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());

  // These are the data sources
  volfrac = &(ebfactory.getVolFrac());
  bndrycent = &(ebfactory.getBndryCent());
  areafrac = ebfactory.getAreaFrac();
  facecent = ebfactory.getFaceCent();
  
  auto const& flags = ebfactory.getMultiEBCellFlagFab();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(*volfrac, false); mfi.isValid(); ++mfi)
  {
    BaseFab<int>& mfab = ebmask[mfi];
    const Box tbox = mfi.growntilebox();
    const Box bx = mfi.tilebox();
    const EBCellFlagFab& flagfab = flags[mfi];
    
    FabType typ = flagfab.getType(tbox);

    if (typ == FabType::regular) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = 1;
      });
    }
    else if (typ == FabType::covered) {
      const auto& mask = ebmask.array(mfi);
      amrex::ParallelFor(bx, [mask]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
          mask(i,j,k) = -1;
      });
    }
    else if (typ == FabType::singlevalued) {
      int Ncut = 0;
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          Ncut++;
        }
      }
    
      for (BoxIterator bit(tbox); bit.ok(); ++bit) {
        const EBCellFlag& flag = flagfab(bit(), 0);
    
        if (!(flag.isRegular() || flag.isCovered())) {
          if (mfab.box().contains(bit())) mfab(bit()) = 0;
        } else {
          if (flag.isRegular()) {
            if (mfab.box().contains(bit())) mfab(bit()) = 1;
          } else if (flag.isCovered()) {
            if (mfab.box().contains(bit())) mfab(bit()) = -1;
          } else {
            if (mfab.box().contains(bit())) mfab(bit()) = 2;
          }
        }
      }
    }
    else {
      amrex::Print() << "unknown (or multivalued) fab type" << std::endl;
      amrex::Abort();
    }   
  }
}